

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_remove(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQObjectPtr val;
  SQObjectPtr local_28;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  pSVar3 = SQVM::GetAt(v,v->_stackbase + 1);
  if (((pSVar3->super_SQObject)._type & 0x4000000) == 0) {
    SVar4 = sq_throwerror(v,"wrong type");
    return SVar4;
  }
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
    SVar5 = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
  }
  else {
    SVar5 = (pSVar3->super_SQObject)._unVal.nInteger;
  }
  bVar1 = SQArray::Get((pSVar2->super_SQObject)._unVal.pArray,SVar5,&local_28);
  if (bVar1) {
    if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
      SVar5 = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar5 = (pSVar3->super_SQObject)._unVal.nInteger;
    }
    SQArray::Remove((pSVar2->super_SQObject)._unVal.pArray,SVar5);
    SVar4 = 1;
    SQVM::Push(v,&local_28);
  }
  else {
    SVar4 = sq_throwerror(v,"idx out of range");
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar4;
}

Assistant:

static SQInteger array_remove(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &idx = stack_get(v, 2);
    if(!sq_isnumeric(idx)) return sq_throwerror(v, _SC("wrong type"));
    SQObjectPtr val;
    if(_array(o)->Get(tointeger(idx), val)) {
        _array(o)->Remove(tointeger(idx));
        v->Push(val);
        return 1;
    }
    return sq_throwerror(v, _SC("idx out of range"));
}